

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::builtins::ArrayUniqueMethod::eval
          (ConstantValue *__return_storage_ptr__,ArrayUniqueMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *callInfo)

{
  group_type_pointer pgVar1;
  uint uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  group_type_pointer pgVar7;
  value_type_pointer pCVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  _Copy_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  _Copy_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__rhs;
  size_t sVar12;
  ConstantValue *pCVar13;
  TRef pCVar14;
  ulong uVar15;
  uint64_t value;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  pair<const_slang::ast::Expression_*,_const_slang::ast::ValueSymbol_*> pVar21;
  uint64_t local_200;
  flat_hash_set<ConstantValue> seen;
  ConstantValue cv;
  CVIterator<false> it;
  ConstantValue arr;
  locator local_100;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  byte bStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  byte bStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_EvalContext_h:113:13)>
  guard;
  SVQueue result;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  Expression::eval(&arr,*args->_M_ptr,context);
  if (arr.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
  }
  else {
    SVQueue::SVQueue(&result);
    pVar21 = CallExpression::SystemCallInfo::getIteratorInfo(callInfo);
    if (pVar21.first == (Expression *)0x0) {
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::unordered_flat_set(&seen);
      begin<slang::ConstantValue,_false>(&it,&arr);
      local_200 = 0;
      while( true ) {
        end<slang::ConstantValue,_false>((CVIterator<false> *)&cv,&arr);
        bVar9 = std::operator==(&it.current,
                                (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                                 *)&cv);
        if (bVar9) break;
        pCVar14 = CVIterator<false>::dereference(&it);
        sVar12 = boost::unordered::detail::foa::mulx_mix::
                 mix<slang::hash<slang::ConstantValue,void>,slang::ConstantValue>
                           ((hash<slang::ConstantValue,_void> *)&seen,pCVar14);
        uVar18 = sVar12 >> ((byte)seen.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar16 = (sVar12 & 0xff) * 4;
        uVar3 = (&UNK_004a00ac)[lVar16];
        uVar4 = (&UNK_004a00ad)[lVar16];
        uVar5 = (&UNK_004a00ae)[lVar16];
        bVar6 = (&UNK_004a00af)[lVar16];
        uVar15 = 0;
        uVar17 = uVar18;
        do {
          pCVar8 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.elements_;
          pgVar7 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_;
          pgVar1 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_ + uVar17;
          local_e8 = pgVar1->m[0].n;
          uStack_e7 = pgVar1->m[1].n;
          uStack_e6 = pgVar1->m[2].n;
          bStack_e5 = pgVar1->m[3].n;
          uStack_e4 = pgVar1->m[4].n;
          uStack_e3 = pgVar1->m[5].n;
          uStack_e2 = pgVar1->m[6].n;
          bStack_e1 = pgVar1->m[7].n;
          uStack_e0 = pgVar1->m[8].n;
          uStack_df = pgVar1->m[9].n;
          uStack_de = pgVar1->m[10].n;
          bStack_dd = pgVar1->m[0xb].n;
          uStack_dc = pgVar1->m[0xc].n;
          uStack_db = pgVar1->m[0xd].n;
          uStack_da = pgVar1->m[0xe].n;
          bVar10 = pgVar1->m[0xf].n;
          auVar20[0] = -(local_e8 == uVar3);
          auVar20[1] = -(uStack_e7 == uVar4);
          auVar20[2] = -(uStack_e6 == uVar5);
          auVar20[3] = -(bStack_e5 == bVar6);
          auVar20[4] = -(uStack_e4 == uVar3);
          auVar20[5] = -(uStack_e3 == uVar4);
          auVar20[6] = -(uStack_e2 == uVar5);
          auVar20[7] = -(bStack_e1 == bVar6);
          auVar20[8] = -(uStack_e0 == uVar3);
          auVar20[9] = -(uStack_df == uVar4);
          auVar20[10] = -(uStack_de == uVar5);
          auVar20[0xb] = -(bStack_dd == bVar6);
          auVar20[0xc] = -(uStack_dc == uVar3);
          auVar20[0xd] = -(uStack_db == uVar4);
          auVar20[0xe] = -(uStack_da == uVar5);
          auVar20[0xf] = -(bVar10 == bVar6);
          uVar11 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
          bStack_d9 = bVar10;
          if (uVar11 != 0) {
            do {
              uVar2 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                }
              }
              bVar9 = slang::operator==(pCVar14,pCVar8 + uVar17 * 0xf + (ulong)uVar2);
              if (bVar9) goto LAB_003fd9a0;
              uVar11 = uVar11 - 1 & uVar11;
            } while (uVar11 != 0);
            bVar10 = pgVar7[uVar17].m[0xf].n;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)sVar12 & 7] & bVar10) == 0) break;
          lVar16 = uVar17 + uVar15;
          uVar15 = uVar15 + 1;
          uVar17 = lVar16 + 1U &
                   seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_size_mask;
        } while (uVar15 <= seen.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                           .arrays.groups_size_mask);
        if (seen.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
            .size_ctrl.size <
            seen.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_at<slang::ConstantValue&>
                    ((locator *)&cv,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                      *)&seen,uVar18,sVar12,pCVar14);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                    ((locator *)&cv,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                      *)&seen,sVar12,pCVar14);
        }
        if (this->isIndexed == true) {
          if (arr.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index == '\a') {
            pCVar13 = CVIterator<false>::key(&it);
            std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            emplace_back<slang::ConstantValue_const&>
                      ((deque<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&result,
                       pCVar13);
          }
          else {
            SVInt::SVInt((SVInt *)&cv,0x20,local_200,true);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::SVInt>
                      (&result.
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                       (SVInt *)&cv);
            SVInt::~SVInt((SVInt *)&cv);
          }
        }
        else {
          pCVar14 = CVIterator<false>::dereference(&it);
          std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>
                    (&result.
                      super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                     pCVar14);
        }
LAB_003fd9a0:
        CVIterator<false>::increment(&it);
        local_200 = (uint64_t)((int)local_200 + 1);
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                     *)&seen);
    }
    else {
      EvalContext::disableCaching(&guard,context);
      local_58._M_index = '\0';
      this_00 = (_Copy_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)EvalContext::createLocal(context,pVar21.second,(ConstantValue *)&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      boost::unordered::
      unordered_flat_set<slang::ConstantValue,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::unordered_flat_set(&seen);
      begin<slang::ConstantValue,_false>(&it,&arr);
      value = 0;
      while( true ) {
        end<slang::ConstantValue,_false>((CVIterator<false> *)&cv,&arr);
        bVar9 = std::operator==(&it.current,
                                (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                                 *)&cv);
        if (bVar9) break;
        __rhs = (_Copy_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)CVIterator<false>::dereference(&it);
        std::__detail::__variant::
        _Copy_assign_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::operator=(this_00,__rhs);
        Expression::eval(&cv,pVar21.first,context);
        sVar12 = boost::unordered::detail::foa::mulx_mix::
                 mix<slang::hash<slang::ConstantValue,void>,slang::ConstantValue>
                           ((hash<slang::ConstantValue,_void> *)&seen,&cv);
        uVar18 = sVar12 >> ((byte)seen.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                                  .arrays.groups_size_index & 0x3f);
        lVar16 = (sVar12 & 0xff) * 4;
        uVar3 = (&UNK_004a00ac)[lVar16];
        uVar4 = (&UNK_004a00ad)[lVar16];
        uVar5 = (&UNK_004a00ae)[lVar16];
        bVar6 = (&UNK_004a00af)[lVar16];
        uVar15 = 0;
        uVar17 = uVar18;
        do {
          pCVar8 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.elements_;
          pgVar7 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_;
          pgVar1 = seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_ + uVar17;
          local_d8 = pgVar1->m[0].n;
          uStack_d7 = pgVar1->m[1].n;
          uStack_d6 = pgVar1->m[2].n;
          bStack_d5 = pgVar1->m[3].n;
          uStack_d4 = pgVar1->m[4].n;
          uStack_d3 = pgVar1->m[5].n;
          uStack_d2 = pgVar1->m[6].n;
          bStack_d1 = pgVar1->m[7].n;
          uStack_d0 = pgVar1->m[8].n;
          uStack_cf = pgVar1->m[9].n;
          uStack_ce = pgVar1->m[10].n;
          bStack_cd = pgVar1->m[0xb].n;
          uStack_cc = pgVar1->m[0xc].n;
          uStack_cb = pgVar1->m[0xd].n;
          uStack_ca = pgVar1->m[0xe].n;
          bVar10 = pgVar1->m[0xf].n;
          auVar19[0] = -(local_d8 == uVar3);
          auVar19[1] = -(uStack_d7 == uVar4);
          auVar19[2] = -(uStack_d6 == uVar5);
          auVar19[3] = -(bStack_d5 == bVar6);
          auVar19[4] = -(uStack_d4 == uVar3);
          auVar19[5] = -(uStack_d3 == uVar4);
          auVar19[6] = -(uStack_d2 == uVar5);
          auVar19[7] = -(bStack_d1 == bVar6);
          auVar19[8] = -(uStack_d0 == uVar3);
          auVar19[9] = -(uStack_cf == uVar4);
          auVar19[10] = -(uStack_ce == uVar5);
          auVar19[0xb] = -(bStack_cd == bVar6);
          auVar19[0xc] = -(uStack_cc == uVar3);
          auVar19[0xd] = -(uStack_cb == uVar4);
          auVar19[0xe] = -(uStack_ca == uVar5);
          auVar19[0xf] = -(bVar10 == bVar6);
          uVar11 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
          bStack_c9 = bVar10;
          if (uVar11 != 0) {
            do {
              uVar2 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
                }
              }
              bVar9 = slang::operator==(&cv,pCVar8 + uVar17 * 0xf + (ulong)uVar2);
              if (bVar9) goto LAB_003fd700;
              uVar11 = uVar11 - 1 & uVar11;
            } while (uVar11 != 0);
            bVar10 = pgVar7[uVar17].m[0xf].n;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)sVar12 & 7] & bVar10) == 0) break;
          lVar16 = uVar17 + uVar15;
          uVar15 = uVar15 + 1;
          uVar17 = lVar16 + 1U &
                   seen.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                   .arrays.groups_size_mask;
        } while (uVar15 <= seen.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                           .arrays.groups_size_mask);
        if (seen.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
            .size_ctrl.size <
            seen.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_slang::hash<slang::ConstantValue>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_at<slang::ConstantValue&>
                    (&local_100,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                      *)&seen,uVar18,sVar12,&cv);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
          ::unchecked_emplace_with_rehash<slang::ConstantValue&>
                    (&local_100,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ConstantValue,void>,std::equal_to<slang::ConstantValue>,std::allocator<slang::ConstantValue>>
                      *)&seen,sVar12,&cv);
        }
        if (this->isIndexed == true) {
          if (arr.value.
              super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              .
              super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ._M_index == '\a') {
            pCVar13 = CVIterator<false>::key(&it);
            std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            emplace_back<slang::ConstantValue_const&>
                      ((deque<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&result,
                       pCVar13);
          }
          else {
            SVInt::SVInt((SVInt *)&local_100,0x20,value,true);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::SVInt>
                      (&result.
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                       (SVInt *)&local_100);
            SVInt::~SVInt((SVInt *)&local_100);
          }
        }
        else {
          pCVar14 = CVIterator<false>::dereference(&it);
          std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>
                    (&result.
                      super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                     pCVar14);
        }
LAB_003fd700:
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&cv);
        CVIterator<false>::increment(&it);
        value = (uint64_t)((int)value + 1);
      }
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::ConstantValue>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ConstantValue,_void>,_std::equal_to<slang::ConstantValue>,_std::allocator<slang::ConstantValue>_>
                     *)&seen);
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/EvalContext.h:113:13)>
      ::~ScopeGuard(&guard);
    }
    ConstantValue::ConstantValue(__return_storage_ptr__,&result);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              (&result.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&arr);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue arr = args[0]->eval(context);
        if (!arr)
            return nullptr;

        SVQueue result;

        auto [iterExpr, iterVar] = callInfo.getIteratorInfo();
        if (iterExpr) {
            SLANG_ASSERT(iterVar);
            auto guard = context.disableCaching();
            auto iterVal = context.createLocal(iterVar);

            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                *iterVal = *it;
                auto cv = iterExpr->eval(context);
                if (seen.emplace(cv).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }
        else {
            uint32_t index = 0;
            flat_hash_set<ConstantValue> seen;
            for (auto it = begin(arr); it != end(arr); ++it, ++index) {
                if (seen.emplace(*it).second) {
                    if (isIndexed && !arr.isMap())
                        result.emplace_back(SVInt(32, index, true));
                    else if (isIndexed)
                        result.emplace_back(it.key());
                    else
                        result.emplace_back(std::move(*it));
                }
            }
        }

        return result;
    }